

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O3

void __thiscall
Lib::
Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
::expand(Stack<Lib::VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>_>
         *this)

{
  IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pIVar1;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pVVar2;
  VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
  *pVVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  size_t sVar6;
  
  sVar6 = 8;
  if (this->_capacity != 0) {
    sVar6 = this->_capacity * 2;
  }
  uVar4 = sVar6 * 8;
  if (uVar4 == 0) {
    pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)FixedSizeAllocator<8UL>::alloc
                          ((FixedSizeAllocator<8UL> *)GLOBAL_SMALL_OBJECT_ALLOCATOR);
  }
  else if (uVar4 < 0x11) {
    pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)FixedSizeAllocator<16UL>::alloc
                          ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
  }
  else if (uVar4 < 0x19) {
    pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)FixedSizeAllocator<24UL>::alloc
                          ((FixedSizeAllocator<24UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x30));
  }
  else if (uVar4 < 0x21) {
    pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)FixedSizeAllocator<32UL>::alloc
                          ((FixedSizeAllocator<32UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  }
  else if (uVar4 < 0x31) {
    pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)FixedSizeAllocator<48UL>::alloc
                          ((FixedSizeAllocator<48UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x60));
  }
  else if (uVar4 < 0x41) {
    pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)FixedSizeAllocator<64UL>::alloc
                          ((FixedSizeAllocator<64UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x78));
  }
  else {
    pVVar3 = (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)::operator_new(uVar4,0x10);
  }
  uVar4 = this->_capacity;
  if (uVar4 == 0) {
    uVar4 = 0;
  }
  else {
    uVar5 = 0;
    do {
      pIVar1 = this->_stack[uVar5]._core;
      pVVar3[uVar5]._core = pIVar1;
      if ((pIVar1 != (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                      *)0x0) && (pIVar1->_refCnt == 0)) {
        (*pIVar1->_vptr_IteratorCore[1])();
        uVar4 = this->_capacity;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < uVar4);
    pVVar2 = this->_stack;
    if (pVVar2 != (VirtualIterator<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
                   *)0x0) {
      uVar5 = uVar4 * 8 + 0xf & 0xfffffffffffffff0;
      if (uVar5 == 0) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = pVVar2;
      }
      else if (uVar5 < 0x11) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = pVVar2;
      }
      else if (uVar5 < 0x19) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = pVVar2;
      }
      else if (uVar5 < 0x21) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = pVVar2;
      }
      else if (uVar5 < 0x31) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = pVVar2;
      }
      else if (uVar5 < 0x41) {
        pVVar2->_core =
             (IteratorCore<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Node_**>
              *)GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = pVVar2;
      }
      else {
        operator_delete(pVVar2,0x10);
        uVar4 = this->_capacity;
      }
    }
  }
  this->_stack = pVVar3;
  this->_cursor = pVVar3 + uVar4;
  this->_end = pVVar3 + sVar6;
  this->_capacity = sVar6;
  return;
}

Assistant:

void expand ()
  {
    ASS(_cursor == _end);

    size_t newCapacity = _capacity ? (2 * _capacity) : 8;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),className());

    C* newStack = static_cast<C*>(mem);
    if(_capacity) {
      for (size_t i = 0; i<_capacity; i++) {
        ::new(newStack+i) C(std::move(_stack[i]));
        _stack[i].~C();
      }
      // deallocate the old stack
      DEALLOC_KNOWN(_stack,_capacity*sizeof(C),className());
    }

    _stack = newStack;
    _cursor = _stack + _capacity;
    _end = _stack + newCapacity;
    _capacity = newCapacity;
  }